

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O2

void __thiscall
Diligent::DearchiverBase::PSOData<Diligent::RayTracingPipelineStateCreateInfo>::AssignShaders
          (PSOData<Diligent::RayTracingPipelineStateCreateInfo> *this)

{
  Uint32 i;
  ulong uVar1;
  long lVar2;
  anon_class_8_1_8991fb9c RemapShader;
  
  lVar2 = 8;
  RemapShader.this = this;
  for (uVar1 = 0; uVar1 < (this->CreateInfo).GeneralShaderCount; uVar1 = uVar1 + 1) {
    AssignShaders::anon_class_8_1_8991fb9c::operator()
              (&RemapShader,(IShader **)((long)&((this->CreateInfo).pGeneralShaders)->Name + lVar2))
    ;
    lVar2 = lVar2 + 0x10;
  }
  lVar2 = 8;
  for (uVar1 = 0; uVar1 < (this->CreateInfo).TriangleHitShaderCount; uVar1 = uVar1 + 1) {
    AssignShaders::anon_class_8_1_8991fb9c::operator()
              (&RemapShader,
               (IShader **)((long)&((this->CreateInfo).pTriangleHitShaders)->Name + lVar2));
    AssignShaders::anon_class_8_1_8991fb9c::operator()
              (&RemapShader,
               (IShader **)
               ((long)&((this->CreateInfo).pTriangleHitShaders)->pClosestHitShader + lVar2));
    lVar2 = lVar2 + 0x18;
  }
  lVar2 = 0x18;
  for (uVar1 = 0; uVar1 < (this->CreateInfo).ProceduralHitShaderCount; uVar1 = uVar1 + 1) {
    AssignShaders::anon_class_8_1_8991fb9c::operator()
              (&RemapShader,
               (IShader **)((long)(this->CreateInfo).pProceduralHitShaders + lVar2 + -0x10));
    AssignShaders::anon_class_8_1_8991fb9c::operator()
              (&RemapShader,
               (IShader **)((long)(this->CreateInfo).pProceduralHitShaders + lVar2 + -8));
    AssignShaders::anon_class_8_1_8991fb9c::operator()
              (&RemapShader,
               (IShader **)((long)&((this->CreateInfo).pProceduralHitShaders)->Name + lVar2));
    lVar2 = lVar2 + 0x20;
  }
  return;
}

Assistant:

void DearchiverBase::PSOData<RayTracingPipelineStateCreateInfo>::AssignShaders()
{
    auto RemapShader = [this](IShader* const& inoutShader) //
    {
        size_t ShaderIndex = BitCast<size_t>(inoutShader);
        if (ShaderIndex < Shaders.size())
            const_cast<IShader*&>(inoutShader) = Shaders[ShaderIndex];
        else
        {
            VERIFY(ShaderIndex == ~0u, "Failed to remap shader");
            const_cast<IShader*&>(inoutShader) = nullptr;
        }
    };

    for (Uint32 i = 0; i < CreateInfo.GeneralShaderCount; ++i)
    {
        RemapShader(CreateInfo.pGeneralShaders[i].pShader);
    }
    for (Uint32 i = 0; i < CreateInfo.TriangleHitShaderCount; ++i)
    {
        RemapShader(CreateInfo.pTriangleHitShaders[i].pClosestHitShader);
        RemapShader(CreateInfo.pTriangleHitShaders[i].pAnyHitShader);
    }
    for (Uint32 i = 0; i < CreateInfo.ProceduralHitShaderCount; ++i)
    {
        RemapShader(CreateInfo.pProceduralHitShaders[i].pIntersectionShader);
        RemapShader(CreateInfo.pProceduralHitShaders[i].pClosestHitShader);
        RemapShader(CreateInfo.pProceduralHitShaders[i].pAnyHitShader);
    }
}